

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_variable * __thiscall
pugi::xpath_variable_set::add(xpath_variable_set *this,char_t *name,xpath_value_type type)

{
  xpath_variable **ppxVar1;
  bool bVar2;
  uint uVar3;
  char_t *src;
  xpath_variable *pxVar4;
  xpath_variable **ppxVar5;
  
  uVar3 = impl::anon_unknown_0::hash_string(name);
  ppxVar1 = this->_data + (uVar3 & 0x3f);
  ppxVar5 = ppxVar1;
  while( true ) {
    pxVar4 = *ppxVar5;
    if (pxVar4 == (xpath_variable *)0x0) {
      pxVar4 = impl::anon_unknown_0::new_xpath_variable(type,name);
      if (pxVar4 == (xpath_variable *)0x0) {
        pxVar4 = (xpath_variable *)0x0;
      }
      else {
        pxVar4->_next = *ppxVar1;
        *ppxVar1 = pxVar4;
      }
      return pxVar4;
    }
    src = xpath_variable::name(pxVar4);
    bVar2 = impl::anon_unknown_0::strequal(src,name);
    if (bVar2) break;
    ppxVar5 = &pxVar4->_next;
  }
  if (pxVar4->_type != type) {
    return (xpath_variable *)0x0;
  }
  return pxVar4;
}

Assistant:

PUGI_IMPL_FN xpath_variable* xpath_variable_set::add(const char_t* name, xpath_value_type type)
	{
		const size_t hash_size = sizeof(_data) / sizeof(_data[0]);
		size_t hash = impl::hash_string(name) % hash_size;

		// look for existing variable
		for (xpath_variable* var = _data[hash]; var; var = var->_next)
			if (impl::strequal(var->name(), name))
				return var->type() == type ? var : NULL;

		// add new variable
		xpath_variable* result = impl::new_xpath_variable(type, name);

		if (result)
		{
			result->_next = _data[hash];

			_data[hash] = result;
		}

		return result;
	}